

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void cppcms::http::context::dispatch
               (intrusive_ptr<cppcms::application> *app,string *url,bool syncronous)

{
  application *paVar1;
  response *prVar2;
  context *pcVar3;
  service *psVar4;
  cached_settings *pcVar5;
  session_interface *psVar6;
  undefined7 in_register_00000011;
  undefined1 local_80 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  string local_40 [32];
  
  if ((int)CONCAT71(in_register_00000011,syncronous) == 0) {
    prVar2 = application::response(app->p_);
    http::response::io_mode(prVar2,asynchronous);
  }
  else {
    prVar2 = application::response(app->p_);
    http::response::io_mode(prVar2,normal);
    pcVar3 = application::context(app->p_);
    psVar4 = service(pcVar3);
    pcVar5 = cppcms::service::cached_settings(psVar4);
    if ((pcVar5->session).disable_automatic_load == false) {
      pcVar3 = application::context(app->p_);
      psVar6 = session(pcVar3);
      session_interface::load(psVar6);
    }
    pcVar3 = application::context(app->p_);
    psVar4 = service(pcVar3);
    pcVar5 = cppcms::service::cached_settings(psVar4);
    if ((pcVar5->session).disable_automatic_load == false) {
      pcVar3 = application::context(app->p_);
      psVar6 = session(pcVar3);
      session_interface::load(psVar6);
    }
  }
  paVar1 = app->p_;
  std::__cxx11::string::string(local_40,(string *)url);
  (*paVar1->_vptr_application[2])(paVar1,local_40);
  std::__cxx11::string::~string(local_40);
  application::get_context((application *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
    if (syncronous) {
      pcVar3 = application::context(app->p_);
      complete_response(pcVar3);
    }
    else {
      pcVar3 = application::context(app->p_);
      async_complete_response(pcVar3);
    }
    application::release_context((application *)(local_80 + 0x20));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
  }
  return;
}

Assistant:

void context::dispatch(booster::intrusive_ptr<application> const &app,std::string const &url,bool syncronous)
{
	try {
		if(syncronous) {
			app->response().io_mode(http::response::normal);
			if(!app->context().service().cached_settings().session.disable_automatic_load)
				app->context().session().load();
		}
		else {
			app->response().io_mode(http::response::asynchronous);
		}

		if(syncronous && !app->context().service().cached_settings().session.disable_automatic_load)
			app->context().session().load();
		app->main(url);
	}
	catch(request_forgery_error const &e) {
		if(app->get_context() && !app->response().some_output_was_written()) {
			app->response().make_error_response(http::response::forbidden);
		}
	}
	catch(...){
		if(app->get_context())
			app->context().translate_exception();
	}
	
	if(app->get_context()) {
		try {
			if(syncronous) {
				app->context().complete_response();
			}
			else  {
				app->context().async_complete_response();
			}
		}
		catch(...) {
			app->release_context();
			throw;
		}
		app->release_context();
	}
}